

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TLaplaceExample1::graduxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *grad)

{
  TPZVec<Fad<double>_> *in_RDX;
  TPZVec<Fad<double>_> *in_RSI;
  int i_1;
  TPZManVector<Fad<Fad<double>_>,_3> result;
  Fad<Fad<double>_> temp;
  int i;
  TPZManVector<Fad<Fad<double>_>,_3> xfad;
  TPZVec<Fad<Fad<double>_>_> *in_stack_00006330;
  TPZVec<Fad<Fad<double>_>_> *in_stack_00006338;
  TLaplaceExample1 *in_stack_00006340;
  Fad<Fad<double>_> *in_stack_fffffffffffffce8;
  int i_00;
  Fad<Fad<double>_> *in_stack_fffffffffffffcf0;
  TPZManVector<Fad<Fad<double>_>,_3> *in_stack_fffffffffffffd00;
  int local_2dc;
  TPZVec<Fad<Fad<double>_>_> local_2d8;
  Fad<double> *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  Fad<Fad<double>_> *in_stack_fffffffffffffd60;
  int64_t in_stack_fffffffffffffd88;
  TPZManVector<Fad<Fad<double>_>,_3> *in_stack_fffffffffffffd90;
  int local_144;
  TPZVec<Fad<Fad<double>_>_> local_140 [9];
  TPZVec<Fad<double>_> *local_18;
  TPZVec<Fad<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZVec<Fad<double>_>::size(in_RSI);
  TPZManVector<Fad<Fad<double>_>,_3>::TPZManVector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  for (local_144 = 0; local_144 < 3; local_144 = local_144 + 1) {
    TPZVec<Fad<double>_>::operator[](local_10,(long)local_144);
    Fad<Fad<double>_>::Fad
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd00 =
         (TPZManVector<Fad<Fad<double>_>,_3> *)
         TPZVec<Fad<Fad<double>_>_>::operator[](local_140,(long)local_144);
    Fad<Fad<double>_>::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    Fad<Fad<double>_>::~Fad(in_stack_fffffffffffffcf0);
  }
  TPZManVector<Fad<Fad<double>_>,_3>::TPZManVector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  uxy<Fad<Fad<double>>>(in_stack_00006340,in_stack_00006338,in_stack_00006330);
  (*local_18->_vptr_TPZVec[4])(local_18,3);
  for (local_2dc = 0; i_00 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20), local_2dc < 3;
      local_2dc = local_2dc + 1) {
    TPZVec<Fad<Fad<double>_>_>::operator[](&local_2d8,0);
    in_stack_fffffffffffffcf0 =
         (Fad<Fad<double>_> *)Fad<Fad<double>_>::d(in_stack_fffffffffffffcf0,i_00);
    in_stack_fffffffffffffce8 =
         (Fad<Fad<double>_> *)TPZVec<Fad<double>_>::operator[](local_18,(long)local_2dc);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffffcf0,(Fad<double> *)in_stack_fffffffffffffce8);
  }
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector(in_stack_fffffffffffffd00);
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector(in_stack_fffffffffffffd00);
  return;
}

Assistant:

void TLaplaceExample1::graduxy<Fad<STATE>>(const TPZVec<Fad<STATE>> &x, TPZVec<Fad<STATE>> &grad) const
{
    typedef Fad<STATE> TVar;
    TPZManVector<Fad<TVar>,3> xfad(x.size());
    for(int i=0; i<3; i++)
    {
        Fad<TVar> temp = Fad<TVar>(3,i,x[i]);
        xfad[i] = temp;
    }
    TPZManVector<Fad<TVar>,3> result(1);
    uxy(xfad,result);
    grad.resize(3);
    for (int i=0; i<3; i++)
    {
            grad[i] = result[0].d(i);
    }
}